

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fuzzing.cpp
# Opt level: O3

Expression * __thiscall
wasm::TranslateToFuzzReader::makeTrivial(TranslateToFuzzReader *this,Type type)

{
  uint32_t uVar1;
  Expression *pEVar2;
  Expression *pEVar3;
  ulong extraout_RDX;
  Type type_00;
  
  this->trivialNesting = this->trivialNesting + 1;
  if (type.id < 2) {
    if (type.id == 0) {
      pEVar2 = (Expression *)MixedArena::allocSpace(&((this->builder).wasm)->allocator,0x10,8);
      pEVar2->_id = NopId;
      (pEVar2->type).id = 0;
    }
    else {
      wasm::HeapType::getSignature();
      if (extraout_RDX < 2) {
        pEVar3 = (Expression *)0x0;
      }
      else {
        wasm::HeapType::getSignature();
        pEVar3 = makeTrivial(this,type_00);
      }
      pEVar2 = (Expression *)MixedArena::allocSpace(&((this->builder).wasm)->allocator,0x18,8);
      pEVar2->_id = ReturnId;
      (pEVar2->type).id = 1;
      *(Expression **)(pEVar2 + 1) = pEVar3;
    }
  }
  else {
    if (this->funcContext != (FunctionCreationContext *)0x0) {
      uVar1 = 2;
      if (6 < type.id) {
        uVar1 = (uint)((type.id & 3) == 0) * 8 + 2;
      }
      uVar1 = Random::upTo(&this->random,uVar1);
      if (uVar1 == 0) {
        pEVar2 = makeLocalGet(this,type);
        goto LAB_00138efa;
      }
    }
    uVar1 = Random::upTo(&this->random,2);
    if (uVar1 == 0) {
      pEVar2 = makeConst(this,type);
    }
    else {
      pEVar2 = makeGlobalGet(this,type);
    }
  }
LAB_00138efa:
  this->trivialNesting = this->trivialNesting + -1;
  return pEVar2;
}

Assistant:

Expression* TranslateToFuzzReader::makeTrivial(Type type) {
  struct TrivialNester {
    TranslateToFuzzReader& parent;
    TrivialNester(TranslateToFuzzReader& parent) : parent(parent) {
      parent.trivialNesting++;
    }
    ~TrivialNester() { parent.trivialNesting--; }
  } nester(*this);

  if (type.isConcrete()) {
    // If we have a function context, use a local half the time. Use a local
    // less often if the local is non-nullable, however, as then we might be
    // using it before it was set, which would trap.
    if (funcContext && oneIn(type.isNonNullable() ? 10 : 2)) {
      return makeLocalGet(type);
    }

    // Either make a const, or a global.get (which may fail to find a suitable
    // global, especially in a non-function context, and if so it will make a
    // constant instead).
    return oneIn(2) ? makeConst(type) : makeGlobalGet(type);
  } else if (type == Type::none) {
    return makeNop(type);
  }
  assert(type == Type::unreachable);
  Expression* ret = nullptr;
  if (funcContext->func->getResults().isConcrete()) {
    ret = makeTrivial(funcContext->func->getResults());
  }
  return builder.makeReturn(ret);
}